

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O0

int htoi(char *str,int nb)

{
  char cVar1;
  int iVar2;
  int local_28;
  int local_24;
  int i;
  int val;
  char c;
  int nb_local;
  char *str_local;
  
  local_24 = 0;
  local_28 = 0;
  do {
    if (nb <= local_28) {
      return local_24;
    }
    iVar2 = toupper((int)str[local_28]);
    cVar1 = (char)iVar2;
    if ((cVar1 < '0') || ('9' < cVar1)) {
      if ((cVar1 < 'A') || ('F' < cVar1)) {
        return -1;
      }
      local_24 = local_24 * 0x10 + cVar1 + -0x37;
    }
    else {
      local_24 = local_24 * 0x10 + cVar1 + -0x30;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

int
htoi(char *str, int nb)
{
	char c;
	int val;
	int i;

	val = 0;

	for (i = 0; i < nb; i++) {
		 c = toupper(str[i]);

		if ((c >= '0') && (c <= '9'))
			val = (val << 4) + (c - '0');
		else if ((c >= 'A') && (c <= 'F'))
			val = (val << 4) + (c - 'A' + 10);
		else
			return (-1);
	}

	/* ok */
	return (val);
}